

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

int __thiscall
QtPrivate::QGenericArrayOps<QCursor>::truncate
          (QGenericArrayOps<QCursor> *this,char *__file,__off_t __length)

{
  QCursor *pQVar1;
  QCursor *in_stack_ffffffffffffffd8;
  QArrayDataPointer<QCursor> *this_00;
  
  pQVar1 = QArrayDataPointer<QCursor>::begin((QArrayDataPointer<QCursor> *)0x37abc1);
  this_00 = (QArrayDataPointer<QCursor> *)(pQVar1 + (long)__file);
  QArrayDataPointer<QCursor>::end(this_00);
  std::destroy<QCursor*>((QCursor *)this_00,in_stack_ffffffffffffffd8);
  (this->super_QArrayDataPointer<QCursor>).size = (qsizetype)__file;
  return (int)this;
}

Assistant:

void truncate(size_t newSize)
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(!this->isShared());
        Q_ASSERT(newSize < size_t(this->size));

        std::destroy(this->begin() + newSize, this->end());
        this->size = newSize;
    }